

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkAppendMsg(IntegrityCk *pCheck,char *zFormat,...)

{
  StrAccum *p;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  checkProgress(pCheck);
  if (pCheck->mxErr != 0) {
    pCheck->mxErr = pCheck->mxErr + -1;
    pCheck->nErr = pCheck->nErr + 1;
    ap[0].reg_save_area = local_c8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    p = &pCheck->errMsg;
    if ((pCheck->errMsg).nChar != 0) {
      sqlite3_str_append(p,"\n",1);
    }
    if (pCheck->zPfx != (char *)0x0) {
      sqlite3_str_appendf(p,pCheck->zPfx,(ulong)pCheck->v0,(ulong)pCheck->v1,(ulong)(uint)pCheck->v2
                         );
    }
    sqlite3_str_vappendf(p,zFormat,ap);
    if ((pCheck->errMsg).accError == '\a') {
      pCheck->rc = 7;
      pCheck->mxErr = 0;
      if (pCheck->nErr == 0) {
        pCheck->nErr = 1;
      }
    }
  }
  return;
}

Assistant:

static void checkAppendMsg(
  IntegrityCk *pCheck,
  const char *zFormat,
  ...
){
  va_list ap;
  checkProgress(pCheck);
  if( !pCheck->mxErr ) return;
  pCheck->mxErr--;
  pCheck->nErr++;
  va_start(ap, zFormat);
  if( pCheck->errMsg.nChar ){
    sqlite3_str_append(&pCheck->errMsg, "\n", 1);
  }
  if( pCheck->zPfx ){
    sqlite3_str_appendf(&pCheck->errMsg, pCheck->zPfx,
                        pCheck->v0, pCheck->v1, pCheck->v2);
  }
  sqlite3_str_vappendf(&pCheck->errMsg, zFormat, ap);
  va_end(ap);
  if( pCheck->errMsg.accError==SQLITE_NOMEM ){
    checkOom(pCheck);
  }
}